

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::degenerateEps(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> local_90;
  cpp_dec_float<50U,_int,_void> local_58;
  
  iVar1 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::delta((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_90,
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 0x61c);
  iVar2 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 0x618);
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  local_58.fpclass = cpp_dec_float_finite;
  local_58.prec_elem = 10;
  local_58.data._M_elems[0] = 0;
  local_58.data._M_elems[1] = 0;
  local_58.data._M_elems[2] = 0;
  local_58.data._M_elems[3] = 0;
  local_58.data._M_elems[4] = 0;
  local_58.data._M_elems[5] = 0;
  local_58.data._M_elems._24_5_ = 0;
  local_58.data._M_elems[7]._1_3_ = 0;
  local_58.data._M_elems._32_5_ = 0;
  local_58._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_58,1.0 - (double)(iVar1 / iVar2));
  v = &local_90;
  if ((&local_58 != &__return_storage_ptr__->m_backend) &&
     (v = &local_58, &local_90 != &__return_storage_ptr__->m_backend)) {
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_90.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_90.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_90.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_90.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_90.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_90.exp;
    (__return_storage_ptr__->m_backend).neg = local_90.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_90.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_90.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
            (&__return_storage_ptr__->m_backend,v);
  return __return_storage_ptr__;
}

Assistant:

R SPxHarrisRT<R>::degenerateEps() const
{
   return this->solver()->delta()
          * (1.0 - this->solver()->numCycle() / this->solver()->maxCycle());
}